

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStream_GetAvailableFrames
                  (PaAlsaStream *self,int queryCapture,int queryPlayback,unsigned_long *available,
                  int *xrunOccurred)

{
  char *format;
  unsigned_long playbackFrames;
  unsigned_long captureFrames;
  ulong local_38;
  ulong local_30;
  
  *xrunOccurred = 0;
  if (queryPlayback == 0 && queryCapture == 0) {
    __assert_fail("queryCapture || queryPlayback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xe77,
                  "PaError PaAlsaStream_GetAvailableFrames(PaAlsaStream *, int, int, unsigned long *, int *)"
                 );
  }
  if (queryCapture != 0) {
    if ((self->capture).pcm == (snd_pcm_t *)0x0) {
      __assert_fail("self->capture.pcm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xe7b,
                    "PaError PaAlsaStream_GetAvailableFrames(PaAlsaStream *, int, int, unsigned long *, int *)"
                   );
    }
    paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames(&self->capture,&local_30,xrunOccurred);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &self->capture, &captureFrames, xrunOccurred )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3708\n"
      ;
      goto LAB_00112c85;
    }
    if (*xrunOccurred != 0) {
      return 0;
    }
  }
  if (queryPlayback != 0) {
    if ((self->playback).pcm == (snd_pcm_t *)0x0) {
      __assert_fail("self->playback.pcm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xe84,
                    "PaError PaAlsaStream_GetAvailableFrames(PaAlsaStream *, int, int, unsigned long *, int *)"
                   );
    }
    paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames(&self->playback,&local_38,xrunOccurred);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &self->playback, &playbackFrames, xrunOccurred )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 3717\n"
      ;
LAB_00112c85:
      PaUtil_DebugPrint(format);
      return paUtilErr_;
    }
    if (*xrunOccurred != 0) {
      return 0;
    }
  }
  if (queryCapture == 0 || queryPlayback == 0) {
    if (queryCapture != 0) {
      local_38 = local_30;
    }
    *available = local_38;
  }
  else {
    if (local_30 < local_38) {
      local_38 = local_30;
    }
    *available = local_38;
  }
  return 0;
}

Assistant:

static PaError PaAlsaStream_GetAvailableFrames( PaAlsaStream *self, int queryCapture, int queryPlayback, unsigned long
        *available, int *xrunOccurred )
{
    PaError result = paNoError;
    unsigned long captureFrames, playbackFrames;
    *xrunOccurred = 0;

    assert( queryCapture || queryPlayback );

    if( queryCapture )
    {
        assert( self->capture.pcm );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &self->capture, &captureFrames, xrunOccurred ) );
        if( *xrunOccurred )
        {
            goto end;
        }
    }
    if( queryPlayback )
    {
        assert( self->playback.pcm );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &self->playback, &playbackFrames, xrunOccurred ) );
        if( *xrunOccurred )
        {
            goto end;
        }
    }

    if( queryCapture && queryPlayback )
    {
        *available = PA_MIN( captureFrames, playbackFrames );
        /*PA_DEBUG(("capture: %lu, playback: %lu, combined: %lu\n", captureFrames, playbackFrames, *available));*/
    }
    else if( queryCapture )
    {
        *available = captureFrames;
    }
    else
    {
        *available = playbackFrames;
    }

end:
error:
    return result;
}